

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O2

int asciiToUTF8(uchar *out,int *outlen,uchar *in,int *inlen)

{
  uchar uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  
  iVar2 = *outlen;
  iVar3 = *inlen;
  lVar5 = 0;
  while( true ) {
    iVar4 = (int)lVar5;
    if (((in + iVar3 <= in + lVar5) || ((long)*outlen <= lVar5 + 5)) || (out + iVar2 <= out + lVar5)
       ) break;
    uVar1 = in[lVar5];
    if ((char)uVar1 < '\0') {
      *outlen = iVar4;
      *inlen = iVar4;
      return -1;
    }
    out[lVar5] = uVar1;
    lVar5 = lVar5 + 1;
  }
  *outlen = iVar4;
  *inlen = iVar4;
  return *outlen;
}

Assistant:

static int
asciiToUTF8(unsigned char* out, int *outlen,
              const unsigned char* in, int *inlen) {
    unsigned char* outstart = out;
    const unsigned char* base = in;
    const unsigned char* processed = in;
    unsigned char* outend = out + *outlen;
    const unsigned char* inend;
    unsigned int c;

    inend = in + (*inlen);
    while ((in < inend) && (out - outstart + 5 < *outlen)) {
	c= *in++;

        if (out >= outend)
	    break;
        if (c < 0x80) {
	    *out++ = c;
	} else {
	    *outlen = out - outstart;
	    *inlen = processed - base;
	    return(-1);
	}

	processed = (const unsigned char*) in;
    }
    *outlen = out - outstart;
    *inlen = processed - base;
    return(*outlen);
}